

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O3

astnode * newast(int type,void *left,void *right)

{
  astnode *paVar1;
  
  paVar1 = (astnode *)smalloc(0x18);
  paVar1->type = type;
  paVar1->left = left;
  paVar1->right = right;
  return paVar1;
}

Assistant:

struct astnode *newast(int type,void *left,void* right)
{
	
	struct astnode *ptr;
	
	ptr=smalloc(sizeof(struct astnode));
	ptr->type=type;
	ptr->left=left;
	ptr->right=right;
	
	return ptr;
	
}